

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEvent.c
# Opt level: O3

UpnpEvent * UpnpEvent_new(void)

{
  UpnpEvent *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpEvent *)calloc(1,0x18);
  if (pUVar1 != (UpnpEvent *)0x0) {
    pUVar2 = UpnpString_new();
    pUVar1->m_SID = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpEvent *UpnpEvent_new(void)
{
	struct s_UpnpEvent *p = calloc(1, sizeof(struct s_UpnpEvent));

	if (!p)
		return 0;

	/*p->m_EventKey = 0;*/
	/*p->m_ChangedVariables = 0;*/
	p->m_SID = UpnpString_new();

	return (UpnpEvent *)p;
}